

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdUnblindTxOutData(void *handle,char *blinding_key,char *locking_script,char *asset_commitment,
                       char *value_commitment,char *commitment_nonce,char *rangeproof,char **asset,
                       int64_t *amount,char **asset_blind_factor,char **value_blind_factor)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  int64_t iVar4;
  Amount AVar5;
  allocator local_2e9;
  char *local_2e8;
  void *local_2e0;
  undefined1 local_2d8 [32];
  char *work_value_blinder;
  char *work_asset_blinder;
  char *work_asset;
  UnblindParameter unblind_data;
  Privkey blinding_key_obj;
  ConfidentialTxOut txout;
  ByteData rangeproof_obj;
  ConfidentialNonce nonce;
  ConfidentialValue value;
  ConfidentialAssetId asset_obj;
  Script locking_script_obj;
  
  work_asset = (char *)0x0;
  work_asset_blinder = (char *)0x0;
  work_value_blinder = (char *)0x0;
  local_2e8 = commitment_nonce;
  local_2e0 = handle;
  cfd::Initialize();
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fbe22;
  txout.super_AbstractTxOut.value_.amount_._0_4_ = 0xc28;
  txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_22fa4d;
  cfd::capi::CheckEmptyString(locking_script,"locking_script",(CfdSourceLocation *)&txout);
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fbe22;
  txout.super_AbstractTxOut.value_.amount_._0_4_ = 0xc29;
  txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_22fa4d;
  cfd::capi::CheckEmptyString(asset_commitment,"asset",(CfdSourceLocation *)&txout);
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fbe22;
  txout.super_AbstractTxOut.value_.amount_._0_4_ = 0xc2a;
  txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_22fa4d;
  cfd::capi::CheckEmptyString(value_commitment,"value_commitment",(CfdSourceLocation *)&txout);
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fbe22;
  txout.super_AbstractTxOut.value_.amount_._0_4_ = 0xc2b;
  txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_22fa4d;
  cfd::capi::CheckEmptyString(local_2e8,"commitment_nonce",(CfdSourceLocation *)&txout);
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fbe22;
  txout.super_AbstractTxOut.value_.amount_._0_4_ = 0xc2c;
  txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_22fa4d;
  cfd::capi::CheckEmptyString(rangeproof,"rangeproof",(CfdSourceLocation *)&txout);
  txout.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4fbe22;
  txout.super_AbstractTxOut.value_.amount_._0_4_ = 0xc2d;
  txout.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_22fa4d;
  cfd::capi::CheckEmptyString(blinding_key,"blinding_key",(CfdSourceLocation *)&txout);
  std::__cxx11::string::string((string *)&txout,locking_script,(allocator *)&unblind_data);
  cfd::core::Script::Script(&locking_script_obj,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  std::__cxx11::string::string((string *)&txout,asset_commitment,(allocator *)&unblind_data);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset_obj,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  std::__cxx11::string::string((string *)&txout,value_commitment,(allocator *)&unblind_data);
  cfd::core::ConfidentialValue::ConfidentialValue(&value,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  std::__cxx11::string::string((string *)&txout,local_2e8,(allocator *)&unblind_data);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  std::__cxx11::string::string((string *)&txout,rangeproof,(allocator *)&unblind_data);
  cfd::core::ByteData::ByteData(&rangeproof_obj,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  std::__cxx11::string::string((string *)&txout,blinding_key,(allocator *)local_2d8);
  bVar1 = cfd::core::Privkey::HasWif((string *)&txout,(NetType *)0x0,(bool *)0x0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&unblind_data,blinding_key,&local_2e9);
    cfd::core::Privkey::FromWif(&blinding_key_obj,(string *)&unblind_data,kCustomChain,true);
  }
  else {
    std::__cxx11::string::string((string *)&unblind_data,blinding_key,&local_2e9);
    cfd::core::Privkey::Privkey(&blinding_key_obj,(string *)&unblind_data,kMainnet,true);
  }
  std::__cxx11::string::~string((string *)&unblind_data);
  std::__cxx11::string::~string((string *)&txout);
  cfd::core::ByteData::ByteData((ByteData *)&unblind_data);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&txout,&locking_script_obj,&asset_obj,&value,&nonce,(ByteData *)&unblind_data,
             &rangeproof_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unblind_data);
  cfd::core::ConfidentialTxOut::Unblind(&unblind_data,&txout,&blinding_key_obj);
  if (asset == (char **)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2d8,&unblind_data.asset);
    pcVar2 = cfd::capi::CreateString((string *)local_2d8);
    work_asset = pcVar2;
    std::__cxx11::string::~string((string *)local_2d8);
  }
  if (asset_blind_factor == (char **)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_2d8,&unblind_data.abf);
    pcVar3 = cfd::capi::CreateString((string *)local_2d8);
    work_asset_blinder = pcVar3;
    std::__cxx11::string::~string((string *)local_2d8);
  }
  local_2e8 = pcVar3;
  if (value_blind_factor == (char **)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_2d8,&unblind_data.vbf);
    pcVar3 = cfd::capi::CreateString((string *)local_2d8);
    work_value_blinder = pcVar3;
    std::__cxx11::string::~string((string *)local_2d8);
  }
  if (amount != (int64_t *)0x0) {
    AVar5 = cfd::core::ConfidentialValue::GetAmount(&unblind_data.value);
    local_2d8._0_8_ = AVar5.amount_;
    local_2d8[8] = AVar5.ignore_check_;
    iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2d8);
    *amount = iVar4;
  }
  if (asset != (char **)0x0) {
    *asset = pcVar2;
  }
  if (asset_blind_factor != (char **)0x0) {
    *asset_blind_factor = local_2e8;
  }
  if (value_blind_factor != (char **)0x0) {
    *value_blind_factor = pcVar3;
  }
  cfd::core::UnblindParameter::~UnblindParameter(&unblind_data);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blinding_key_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&rangeproof_obj);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce);
  cfd::core::ConfidentialValue::~ConfidentialValue(&value);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset_obj);
  cfd::core::Script::~Script(&locking_script_obj);
  return 0;
}

Assistant:

int CfdUnblindTxOutData(
    void* handle, const char* blinding_key, const char* locking_script,
    const char* asset_commitment, const char* value_commitment,
    const char* commitment_nonce, const char* rangeproof, char** asset,
    int64_t* amount, char** asset_blind_factor, char** value_blind_factor) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_asset = nullptr;
  char* work_asset_blinder = nullptr;
  char* work_value_blinder = nullptr;
  try {
    cfd::Initialize();
    CheckEmptyString(locking_script, "locking_script", CFD_LOG_SOURCE);
    CheckEmptyString(asset_commitment, "asset", CFD_LOG_SOURCE);
    CheckEmptyString(value_commitment, "value_commitment", CFD_LOG_SOURCE);
    CheckEmptyString(commitment_nonce, "commitment_nonce", CFD_LOG_SOURCE);
    CheckEmptyString(rangeproof, "rangeproof", CFD_LOG_SOURCE);
    CheckEmptyString(blinding_key, "blinding_key", CFD_LOG_SOURCE);

    Script locking_script_obj(locking_script);
    ConfidentialAssetId asset_obj(asset_commitment);
    ConfidentialValue value(value_commitment);
    ConfidentialNonce nonce(commitment_nonce);
    ByteData rangeproof_obj(rangeproof);
    Privkey blinding_key_obj = Privkey::HasWif(blinding_key)
                                   ? Privkey::FromWif(blinding_key)
                                   : Privkey(blinding_key);
    ConfidentialTxOut txout(
        locking_script_obj, asset_obj, value, nonce, ByteData(),
        rangeproof_obj);
    auto unblind_data = txout.Unblind(blinding_key_obj);

    if (asset != nullptr) {
      work_asset = CreateString(unblind_data.asset.GetHex());
    }
    if (asset_blind_factor != nullptr) {
      work_asset_blinder = CreateString(unblind_data.abf.GetHex());
    }
    if (value_blind_factor != nullptr) {
      work_value_blinder = CreateString(unblind_data.vbf.GetHex());
    }
    if (amount != nullptr) {
      *amount = unblind_data.value.GetAmount().GetSatoshiValue();
    }

    if (asset != nullptr) *asset = work_asset;
    if (asset_blind_factor != nullptr) {
      *asset_blind_factor = work_asset_blinder;
    }
    if (value_blind_factor != nullptr) {
      *value_blind_factor = work_value_blinder;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_asset, &work_asset_blinder, &work_value_blinder);
  return result;
}